

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CmakeRegenTest.cpp
# Opt level: O2

void __thiscall TestRegenerateCmakeAddDependencies::Run(TestRegenerateCmakeAddDependencies *this)

{
  __type _Var1;
  runtime_error *this_00;
  string expectedOutput;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f0;
  ostringstream oss;
  Component comp;
  
  boost::filesystem::path::path((path *)&oss,"./MyComponent");
  Component::Component(&comp,(path *)&oss);
  std::__cxx11::string::~string((string *)&oss);
  std::__cxx11::string::string((string *)&oss,"ComponentA",(allocator *)&expectedOutput);
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)&comp.buildAfters,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&oss);
  std::__cxx11::string::~string((string *)&oss);
  std::__cxx11::string::string((string *)&oss,"ComponentB",(allocator *)&expectedOutput);
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)&comp.buildAfters,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&oss);
  std::__cxx11::string::~string((string *)&oss);
  std::__cxx11::string::string
            ((string *)&expectedOutput,
             "add_dependencies(${PROJECT_NAME}\n  ComponentA\n  ComponentB\n)\n\n",(allocator *)&oss
            );
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
  RegenerateCmakeAddDependencies((ostream *)&oss,&comp);
  std::__cxx11::stringbuf::str();
  _Var1 = std::operator==(&local_3f0,&expectedOutput);
  std::__cxx11::string::~string((string *)&local_3f0);
  if (_Var1) {
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss);
    std::__cxx11::string::~string((string *)&expectedOutput);
    Component::~Component(&comp);
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Assertion failed: oss.str() == expectedOutput");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

TEST(RegenerateCmakeAddDependencies) {
  Component comp("./MyComponent");
  comp.buildAfters.insert("ComponentA");
  comp.buildAfters.insert("ComponentB");

  const std::string expectedOutput(
      "add_dependencies(${PROJECT_NAME}\n"
      "  ComponentA\n"
      "  ComponentB\n"
      ")\n"
      "\n");

  std::ostringstream oss;
  RegenerateCmakeAddDependencies(oss, comp);

  ASSERT(oss.str() == expectedOutput);
}